

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinedH264Demuxer.cpp
# Opt level: O2

void __thiscall CombinedH264Demuxer::openFile(CombinedH264Demuxer *this,string *streamName)

{
  int iVar1;
  ostream *poVar2;
  undefined4 *puVar3;
  uint *local_1a8;
  undefined8 local_1a0;
  uint local_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  ostringstream ss;
  
  iVar1 = (*this->m_bufferedReader->_vptr_AbstractReader[8])
                    (this->m_bufferedReader,(ulong)(uint)this->m_readerID,
                     (streamName->_M_dataplus)._M_p,0,0);
  if ((char)iVar1 != '\0') {
    this->m_dataProcessed = 0;
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  poVar2 = std::operator<<((ostream *)&ss,"Can\'t open stream ");
  std::operator<<(poVar2,(string *)streamName);
  puVar3 = (undefined4 *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  *puVar3 = 100;
  *(undefined4 **)(puVar3 + 2) = puVar3 + 6;
  if (local_1a8 == &local_198) {
    puVar3[6] = local_198;
    puVar3[7] = uStack_194;
    puVar3[8] = uStack_190;
    puVar3[9] = uStack_18c;
  }
  else {
    *(uint **)(puVar3 + 2) = local_1a8;
    *(ulong *)(puVar3 + 6) = CONCAT44(uStack_194,local_198);
  }
  *(undefined8 *)(puVar3 + 4) = local_1a0;
  local_198 = local_198 & 0xffffff00;
  __cxa_throw(puVar3,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
}

Assistant:

void CombinedH264Demuxer::openFile(const std::string& streamName)
{
    readClose();

    if (!m_bufferedReader->openStream(m_readerID, streamName.c_str()))
        THROW(ERR_FILE_NOT_FOUND, "Can't open stream " << streamName)

    m_dataProcessed = 0;
}